

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

int64_t __thiscall
hta::storage::file::Metric::find_index_before_or_on(Metric *this,TimePoint t,int64_t sz)

{
  int iVar1;
  TimeAggregate *chunk;
  undefined4 extraout_var;
  duration dVar2;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar3;
  pointer pTVar4;
  TimePoint TVar5;
  long extraout_RDX;
  Duration interval;
  Duration interval_00;
  uint64_t uVar6;
  uint64_t index;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> level;
  Meta m;
  
  iVar1 = (*(this->super_Metric)._vptr_Metric[0xc])();
  if ((long)t.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r < CONCAT44(extraout_var,iVar1)) {
    uVar6 = 0xffffffffffffffff;
  }
  else if ((long)t.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r < extraout_RDX) {
    (**(this->super_Metric)._vptr_Metric)(&m,this);
    uVar6 = 0;
    interval = m.interval_min;
    do {
      interval_00.__r = m.interval_factor * interval.__r;
      dVar2.__r = (rep)interval_begin(t,interval);
      tVar3.__d.__r = (duration)interval_begin(t,interval_00);
      if (m.interval_max.__r < interval_00.__r) {
        tVar3.__d.__r = (duration)epoch(this,interval);
      }
      if ((duration)dVar2.__r != tVar3.__d.__r) {
        (*(this->super_Metric)._vptr_Metric[6])(&level,this,tVar3.__d.__r,dVar2.__r,interval.__r,1);
        for (pTVar4 = level.
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pTVar4 != level.
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pTVar4 = pTVar4 + 1) {
          uVar6 = uVar6 + (pTVar4->aggregate).count;
        }
        std::_Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~_Vector_base
                  (&level.
                    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>);
      }
      TVar5 = epoch(this,interval);
      interval.__r = interval_00.__r;
    } while ((long)TVar5.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r < (long)tVar3.__d.__r);
    do {
      index = uVar6;
      if (sz <= (long)index) break;
      TVar5 = get_raw_ts(this,index);
      uVar6 = index + 1;
    } while ((long)TVar5.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r <=
             (long)t.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r);
    uVar6 = index - 1;
    if ((long)uVar6 < 0) {
      __assert_fail("index >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x98,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                   );
    }
    TVar5 = get_raw_ts(this,uVar6);
    if ((long)t.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)TVar5.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __assert_fail("get_raw_ts(index) <= t",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x99,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                   );
    }
    if ((sz != index) &&
       (TVar5 = get_raw_ts(this,index),
       (long)TVar5.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r <=
       (long)t.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r)) {
      __assert_fail("index == int64_t(sz - 1) || get_raw_ts(index + 1) > t",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x9a,
                    "int64_t hta::storage::file::Metric::find_index_before_or_on(TimePoint, int64_t)"
                   );
    }
  }
  else {
    uVar6 = sz - 1;
  }
  return uVar6;
}

Assistant:

int64_t Metric::find_index_before_or_on(TimePoint t, int64_t sz)
{
    auto [begin, end] = range();
    if (begin > t)
    {
        return -1;
    }
    if (end <= t)
    {
        return sz - 1;
    }

    int64_t index = 0;
    auto m = meta();
    Duration interval = m.interval_min;

    while (true)
    {
        auto interval_next = interval * m.interval_factor;
        auto interval_begin_current = interval_begin(t, interval);
        auto interval_begin_next = interval_begin(t, interval_next);

        if (interval_next > m.interval_max)
        {
            interval_begin_next = epoch(interval);
        }

        if (interval_begin_current != interval_begin_next)
        {
            auto level = this->get(interval_begin_next, interval_begin_current, interval,
                                   { Scope::closed, Scope::open });
            for (const auto& chunk : level)
            {
                index += chunk.aggregate.count;
            }
        }

        if (interval_begin_next <= epoch(interval))
        {
            break;
        }
        interval = interval_next;
    }

    // >= index points are now *before* t
    // but we don't know if index itself is before or after t.. so go back one
    index--;
    for (; index + 1 < sz && get_raw_ts(index + 1) <= t; index++)
        ;

    assert(index >= 0); // should be covered by the check at beginning
    assert(get_raw_ts(index) <= t);
    assert(index == int64_t(sz - 1) || get_raw_ts(index + 1) > t);
    return index;
}